

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HDualMulti.cpp
# Opt level: O1

void __thiscall HDual::major_rollback(HDual *this)

{
  int *piVar1;
  HModel *pHVar2;
  pointer piVar3;
  pointer pdVar4;
  bool bVar5;
  pointer piVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  
  lVar9 = (long)this->multi_nFinish;
  if (0 < lVar9) {
    do {
      pHVar2 = this->model;
      piVar6 = (pHVar2->nonbasicMove).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar6[this->multi_finish[lVar9 + -1].columnIn] = this->multi_finish[lVar9 + -1].moveIn;
      piVar3 = (pHVar2->nonbasicFlag).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar3[this->multi_finish[lVar9 + -1].columnIn] = 1;
      piVar6[this->multi_finish[lVar9 + -1].columnOut] = 0;
      piVar3[this->multi_finish[lVar9 + -1].columnOut] = 0;
      (pHVar2->basicIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start[this->multi_finish[lVar9 + -1].rowOut] =
           this->multi_finish[lVar9 + -1].columnOut;
      HModel::updateMatrix
                (pHVar2,this->multi_finish[lVar9 + -1].columnOut,
                 this->multi_finish[lVar9 + -1].columnIn);
      piVar6 = this->multi_finish[lVar9 + -1].flipList.super__Vector_base<int,_std::allocator<int>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (this->multi_finish[lVar9 + -1].flipList.super__Vector_base<int,_std::allocator<int>_>.
          _M_impl.super__Vector_impl_data._M_finish != piVar6) {
        uVar7 = 0;
        uVar8 = 1;
        do {
          HModel::flipBound(this->model,piVar6[uVar7]);
          piVar6 = this->multi_finish[lVar9 + -1].flipList.
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start;
          bVar5 = uVar8 < (ulong)((long)this->multi_finish[lVar9 + -1].flipList.
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_finish - (long)piVar6 >> 2);
          uVar7 = uVar8;
          uVar8 = (ulong)((int)uVar8 + 1);
        } while (bVar5);
      }
      pHVar2 = this->model;
      pdVar4 = (pHVar2->workShift).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar4[this->multi_finish[lVar9 + -1].columnIn] = 0.0;
      pdVar4[this->multi_finish[lVar9 + -1].columnOut] = this->multi_finish[lVar9 + -1].shiftOut;
      piVar1 = &pHVar2->numberIteration;
      *piVar1 = *piVar1 + -1;
      bVar5 = 1 < lVar9;
      lVar9 = lVar9 + -1;
    } while (bVar5);
  }
  return;
}

Assistant:

void HDual::major_rollback() {
    for (int iFn = multi_nFinish - 1; iFn >= 0; iFn--) {
        MFinish *Fin = &multi_finish[iFn];

        // 1. Roll back pivot
        model->getNonbasicMove()[Fin->columnIn] = Fin->moveIn;
        model->getNonbasicFlag()[Fin->columnIn] = 1;
        model->getNonbasicMove()[Fin->columnOut] = 0;
        model->getNonbasicFlag()[Fin->columnOut] = 0;
        model->getBaseIndex()[Fin->rowOut] = Fin->columnOut;

        // 2. Roll back matrix
        model->updateMatrix(Fin->columnOut, Fin->columnIn);

        // 3. Roll back flips
        for (unsigned i = 0; i < Fin->flipList.size(); i++)
            model->flipBound(Fin->flipList[i]);

        // 4. Roll back cost
        model->getWorkShift()[Fin->columnIn] = 0;
        model->getWorkShift()[Fin->columnOut] = Fin->shiftOut;

        // 5. The iteration count
        model->numberIteration--;
    }
}